

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool search_file_recursive(char *path,char *wildcard,char *result,uint *pc,uint max)

{
  uint uVar1;
  _Bool _Var2;
  size_t sVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  char *__s;
  char temp [260];
  char local_138 [264];
  
  sVar3 = strlen(path);
  if ((sVar3 - 0x104 < 0xfffffffffffffefb) || (__dirp = opendir(path), __dirp == (DIR *)0x0)) {
    _Var2 = false;
  }
  else {
    do {
      while( true ) {
        do {
          do {
            pdVar4 = readdir(__dirp);
            if (pdVar4 == (dirent *)0x0) goto LAB_0014ac0a;
          } while ((pdVar4->d_name[0] == '.') &&
                  ((pdVar4->d_name[1] == '\0' ||
                   ((pdVar4->d_name[1] == '.' && (pdVar4->d_name[2] == '\0'))))));
          __s = pdVar4->d_name;
          sVar3 = strlen(path);
          sVar5 = strlen(__s);
        } while ((sVar5 + sVar3) - 0x102 < 0xfffffffffffffefb);
        strcpy(local_138,path);
        strcat(local_138,G_SLASH_CHAR);
        strcat(local_138,__s);
        _Var2 = exists_dir(local_138);
        if (_Var2) break;
        uVar1 = *pc;
        *pc = uVar1 + 1;
        if (max < uVar1 + 1) goto LAB_0014ac0a;
        _Var2 = wildcard_match(wildcard,__s);
        if (_Var2) {
          strcpy(result,local_138);
LAB_0014ac01:
          _Var2 = true;
          goto LAB_0014ac0c;
        }
      }
      _Var2 = search_file_recursive(local_138,wildcard,result,pc,max);
      if (_Var2) goto LAB_0014ac01;
    } while (*pc <= max);
LAB_0014ac0a:
    _Var2 = false;
LAB_0014ac0c:
    closedir(__dirp);
  }
  return _Var2;
}

Assistant:

bool search_file_recursive(const char *path, const char *wildcard, char *result, unsigned int *pc, const unsigned int max)
{
	if (strlen(path) + 1 > MAX_PATH)
	{
		return false;
	}
	DIR *dir;
	char opendirpath[MAX_PATH];
	clear_path_string(opendirpath, MAX_PATH);
#if defined(_WIN32)
	char *res = u8tosjis_path(path, opendirpath);
	if (res == NULL)
	{
		return false;
	}
	if ((dir = opendir(opendirpath)) == NULL)
#else
	if ((dir = opendir(path)) == NULL)
#endif
	{
		return false;
	}
	char temp[MAX_PATH];
	struct dirent *entry;
	bool found = false;
	while ((entry = readdir(dir)) != NULL)
	{
		if (strcmp(entry->d_name, ".") == 0 || strcmp(entry->d_name, "..") == 0)
		{
			continue;
		}
		if (strlen(path) + 1 + strlen(entry->d_name) + 2 > MAX_PATH)
		{
			continue;
		}
		strcpy(temp, path);
		strcat(temp, G_SLASH_CHAR);
		strcat(temp, entry->d_name);
		if (exists_dir(temp))
		{
			if (search_file_recursive(temp, wildcard, result, pc, max))
			{
				found = true;
				break;
			}
			if (*pc > max)
			{
				break;
			}
		}
		else
		{
			*pc += 1;
			if (*pc > max)
			{
				break;
			}

			if (!wildcard_match(wildcard, entry->d_name))
			{
				continue;
			}
			strcpy(result, temp);
			found = true;
			break;
		}
	}
	closedir(dir);
	return found;
}